

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ClusterList.h
# Opt level: O3

void __thiscall
SegmentClusterList<unsigned_int,_Memory::JitArenaAllocator,_16U>::SegmentClusterList
          (SegmentClusterList<unsigned_int,_Memory::JitArenaAllocator,_16U> *this,
          JitArenaAllocator *allocator,uint maxCount)

{
  code *pcVar1;
  bool bVar2;
  BOOL BVar3;
  undefined4 *puVar4;
  uint **__s;
  uint uVar5;
  ulong requestedBytes;
  
  uVar5 = maxCount + 0xf;
  this->maxIndex = uVar5 & 0xfffffff0;
  this->backingStore = (uint **)0x0;
  this->consolidated = true;
  this->alloc = allocator;
  __s = (uint **)&DAT_00000008;
  if (0xf < uVar5) {
    BVar3 = ExceptionCheck::CanHandleOutOfMemory();
    if (BVar3 == 0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar4 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                         ,0x1fb,"(ExceptionCheck::CanHandleOutOfMemory())",
                         "ExceptionCheck::CanHandleOutOfMemory()");
      if (!bVar2) goto LAB_003ecfcc;
      *puVar4 = 0;
    }
    uVar5 = uVar5 >> 1 & 0xfffffff8;
    requestedBytes = (ulong)uVar5;
    __s = (uint **)Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::
                   AllocInternal((ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>
                                  *)allocator,requestedBytes);
    memset(__s,0,requestedBytes);
    memset((char *)((long)__s + requestedBytes),0,(uVar5 + 0xf & 0xfffffff0) - requestedBytes);
    if (__s == (uint **)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar4 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                         ,0x1fe,"(buffer != nullptr)","buffer != nullptr");
      if (!bVar2) {
LAB_003ecfcc:
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      *puVar4 = 0;
      __s = (uint **)0x0;
    }
  }
  this->backingStore = __s;
  return;
}

Assistant:

SegmentClusterList(TAllocator* allocator, indexType maxCount)
        : maxIndex(maxCount % numPerSegment == 0 ? maxCount : maxCount + (numPerSegment - (maxCount % numPerSegment)))
        , backingStore(nullptr)
        , alloc(allocator)
#if DBG
        , consolidated(true)
#endif
    {
        backingStore = AllocatorNewArrayZ(TAllocator, alloc, indexType*, maxIndex / numPerSegment);
    }